

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cc
# Opt level: O1

bool util::is_valid_player_name(char *str,size_t len,bool allow_empty)

{
  char cVar1;
  int iVar2;
  ulong uVar3;
  bool bVar4;
  
  if ((len < 0x41) && ((allow_empty || ((str != (char *)0x0 && (*str != '0')))))) {
    bVar4 = len == 0;
    if ((!bVar4) && (cVar1 = *str, cVar1 != ' ')) {
      uVar3 = 1;
      do {
        iVar2 = isprint((int)cVar1);
        if (iVar2 == 0) {
          return bVar4;
        }
        bVar4 = len <= uVar3;
        if (uVar3 == len) {
          return bVar4;
        }
        cVar1 = str[uVar3];
        uVar3 = uVar3 + 1;
      } while (cVar1 != ' ');
    }
  }
  else {
    bVar4 = false;
  }
  return bVar4;
}

Assistant:

bool is_valid_player_name(const char* str, size_t len, bool allow_empty/* = true*/)
{
	constexpr size_t max_name_len = 64;
	if (len > max_name_len)
		return false;

	if (!allow_empty && (str == nullptr || *str == '0'))
		return false;

	for (size_t i = 0; i < len; ++i)
		if (str[i] == ' ' || !isprint(str[i]))
			return false;

	return true;
}